

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O3

Matrix<float,_4,_4> * tcu::operator*(Matrix<float,_4,_2> *a,Matrix<float,_2,_4> *b)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  long lVar11;
  Matrix<float,_4,_4> *res;
  float *in_RDI;
  float *pfVar12;
  int row;
  long lVar13;
  long lVar14;
  undefined4 uVar15;
  
  *(undefined8 *)(in_RDI + 0xc) = 0;
  *(undefined8 *)(in_RDI + 0xe) = 0;
  *(undefined8 *)(in_RDI + 8) = 0;
  *(undefined8 *)(in_RDI + 10) = 0;
  *(undefined8 *)(in_RDI + 4) = 0;
  *(undefined8 *)(in_RDI + 6) = 0;
  in_RDI[0] = 0.0;
  in_RDI[1] = 0.0;
  *(undefined8 *)(in_RDI + 2) = 0;
  lVar11 = 0;
  lVar13 = 0;
  pfVar12 = in_RDI;
  do {
    lVar14 = 0;
    do {
      uVar15 = 0x3f800000;
      if (lVar11 != lVar14) {
        uVar15 = 0;
      }
      *(undefined4 *)((long)pfVar12 + lVar14) = uVar15;
      lVar14 = lVar14 + 0x10;
    } while (lVar14 != 0x40);
    lVar13 = lVar13 + 1;
    pfVar12 = pfVar12 + 1;
    lVar11 = lVar11 + 0x10;
  } while (lVar13 != 4);
  fVar3 = (b->m_data).m_data[0].m_data[0];
  fVar4 = (b->m_data).m_data[0].m_data[1];
  fVar5 = (b->m_data).m_data[1].m_data[0];
  fVar6 = (b->m_data).m_data[1].m_data[1];
  fVar7 = (b->m_data).m_data[2].m_data[0];
  fVar8 = (b->m_data).m_data[2].m_data[1];
  fVar9 = (b->m_data).m_data[3].m_data[0];
  fVar10 = (b->m_data).m_data[3].m_data[1];
  lVar11 = -4;
  do {
    fVar1 = (a->m_data).m_data[1].m_data[lVar11];
    fVar2 = a[1].m_data.m_data[0].m_data[lVar11];
    in_RDI[lVar11 + 4] = fVar2 * fVar4 + fVar1 * fVar3 + 0.0;
    in_RDI[lVar11 + 8] = fVar2 * fVar6 + fVar1 * fVar5 + 0.0;
    in_RDI[lVar11 + 0xc] = fVar2 * fVar8 + fVar1 * fVar7 + 0.0;
    in_RDI[lVar11 + 0x10] = fVar2 * fVar10 + fVar1 * fVar9 + 0.0;
    lVar11 = lVar11 + 1;
  } while (lVar11 != 0);
  return (Matrix<float,_4,_4> *)in_RDI;
}

Assistant:

Matrix<T, Rows0, Cols1> operator* (const Matrix<T, Rows0, Cols0>& a, const Matrix<T, Rows1, Cols1>& b)
{
	DE_STATIC_ASSERT(Cols0 == Rows1);
	Matrix<T, Rows0, Cols1> res;
	for (int row = 0; row < Rows0; row++)
	{
		for (int col = 0; col < Cols1; col++)
		{
			T v = T(0);
			for (int ndx = 0; ndx < Cols0; ndx++)
				v += a(row,ndx) * b(ndx,col);
			res(row,col) = v;
		}
	}
	return res;
}